

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>::matches
          (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *this,
          candidate_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> candidate)

{
  bool bVar1;
  bool local_39;
  MatchSelf<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_29;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_28;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted;
  candidate_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> candidate_local;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *this_local;
  
  casted = candidate;
  candidate_local = (candidate_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)this;
  bVar1 = dynCastCandidate<wasm::Match::Internal::AnyKind<wasm::Expression_*>,_0>
                    (candidate,&local_28);
  if (bVar1) {
    if (this->binder != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
      *this->binder = local_28;
    }
    bVar1 = MatchSelf<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>::operator()
                      (&local_29,local_28);
    local_39 = false;
    if (bVar1) {
      local_39 = Components<wasm::Match::Internal::AnyKind<wasm::Expression_*>,_0,_void>::match
                           (local_28);
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }